

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O2

void __thiscall wasm::InstrumentMemory::visitModule(InstrumentMemory *this,Module *curr)

{
  pointer puVar1;
  size_t sVar2;
  char *pcVar3;
  Module *pMVar4;
  InstrumentMemory *pIVar5;
  Type TVar6;
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  initializer_list<wasm::Type> types_06;
  initializer_list<wasm::Type> types_07;
  initializer_list<wasm::Type> types_08;
  initializer_list<wasm::Type> types_09;
  initializer_list<wasm::Type> types_10;
  initializer_list<wasm::Type> types_11;
  initializer_list<wasm::Type> types_12;
  initializer_list<wasm::Type> types_13;
  initializer_list<wasm::Type> types_14;
  initializer_list<wasm::Type> types_15;
  initializer_list<wasm::Type> types_16;
  initializer_list<wasm::Type> types_17;
  initializer_list<wasm::Type> types_18;
  initializer_list<wasm::Type> types_19;
  initializer_list<wasm::Type> types_20;
  initializer_list<wasm::Type> types_21;
  initializer_list<wasm::Type> types_22;
  initializer_list<wasm::Type> types_23;
  initializer_list<wasm::Type> types_24;
  initializer_list<wasm::Type> types_25;
  initializer_list<wasm::Type> types_26;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  Name name_08;
  Name name_09;
  Name name_10;
  Name name_11;
  Name name_12;
  Name name_13;
  Name name_14;
  Name name_15;
  Name name_16;
  Name name_17;
  Name name_18;
  Name name_19;
  Name name_20;
  Name name_21;
  Name name_22;
  Name name_23;
  Name name_24;
  Name name_25;
  Name name_26;
  Type local_150;
  Type local_148;
  Type local_140;
  Type local_138;
  Type local_130;
  Type local_128;
  Type local_120;
  Type local_118;
  Type local_110;
  Type local_108;
  Type local_100;
  Type local_f8;
  Type local_f0;
  Type local_e8;
  Type local_e0;
  Type local_d8;
  Type local_d0;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type local_78;
  char *local_70;
  Module *local_68;
  InstrumentMemory *local_60;
  Type local_58;
  undefined8 local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  Type local_38;
  
  sVar2 = load_ptr;
  puVar1 = (curr->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TVar6.id = 2;
  if (puVar1 != (curr->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    TVar6.id = (((puVar1->_M_t).
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id;
  }
  local_70 = DAT_01175940;
  local_58.id = 2;
  local_50 = 2;
  types._M_len = 4;
  types._M_array = &local_58;
  local_68 = curr;
  local_60 = this;
  local_48 = TVar6.id;
  local_40 = TVar6.id;
  local_38.id = TVar6.id;
  wasm::Type::Type(&local_150,types);
  pIVar5 = local_60;
  name.super_IString.str._M_str = local_70;
  name.super_IString.str._M_len = sVar2;
  addImport(local_60,local_68,name,local_150,TVar6);
  pcVar3 = DAT_01175950;
  sVar2 = load_val_i32;
  local_58.id = 2;
  local_50 = 2;
  types_00._M_len = 2;
  types_00._M_array = &local_58;
  wasm::Type::Type(&local_148,types_00);
  pMVar4 = local_68;
  name_00.super_IString.str._M_str = pcVar3;
  name_00.super_IString.str._M_len = sVar2;
  addImport(pIVar5,local_68,name_00,local_148,(Type)0x2);
  pcVar3 = DAT_01175960;
  sVar2 = load_val_i64;
  local_58.id = 2;
  local_50 = 3;
  types_01._M_len = 2;
  types_01._M_array = &local_58;
  wasm::Type::Type(&local_140,types_01);
  pIVar5 = local_60;
  name_01.super_IString.str._M_str = pcVar3;
  name_01.super_IString.str._M_len = sVar2;
  addImport(local_60,pMVar4,name_01,local_140,(Type)0x3);
  pcVar3 = DAT_01175970;
  sVar2 = load_val_f32;
  local_58.id = 2;
  local_50 = 4;
  types_02._M_len = 2;
  types_02._M_array = &local_58;
  wasm::Type::Type(&local_b8,types_02);
  name_02.super_IString.str._M_str = pcVar3;
  name_02.super_IString.str._M_len = sVar2;
  addImport(pIVar5,pMVar4,name_02,local_b8,(Type)0x4);
  pcVar3 = DAT_01175980;
  sVar2 = load_val_f64;
  local_58.id = 2;
  local_50 = 5;
  types_03._M_len = 2;
  types_03._M_array = &local_58;
  wasm::Type::Type(&local_b0,types_03);
  pMVar4 = local_68;
  name_03.super_IString.str._M_str = pcVar3;
  name_03.super_IString.str._M_len = sVar2;
  addImport(pIVar5,local_68,name_03,local_b0,(Type)0x5);
  TVar6.id = local_38.id;
  pcVar3 = DAT_01175990;
  local_70 = (char *)store_ptr;
  local_58.id = 2;
  local_50 = 2;
  local_48 = local_38.id;
  local_40 = local_38.id;
  types_04._M_len = 4;
  types_04._M_array = &local_58;
  wasm::Type::Type(&local_138,types_04);
  pIVar5 = local_60;
  name_04.super_IString.str._M_str = pcVar3;
  name_04.super_IString.str._M_len = (size_t)local_70;
  addImport(local_60,pMVar4,name_04,local_138,TVar6);
  pcVar3 = DAT_011759a0;
  sVar2 = store_val_i32;
  local_58.id = 2;
  local_50 = 2;
  types_05._M_len = 2;
  types_05._M_array = &local_58;
  wasm::Type::Type(&local_a8,types_05);
  name_05.super_IString.str._M_str = pcVar3;
  name_05.super_IString.str._M_len = sVar2;
  addImport(pIVar5,pMVar4,name_05,local_a8,(Type)0x2);
  pcVar3 = DAT_011759b0;
  sVar2 = store_val_i64;
  local_58.id = 2;
  local_50 = 3;
  types_06._M_len = 2;
  types_06._M_array = &local_58;
  wasm::Type::Type(&local_130,types_06);
  pMVar4 = local_68;
  name_06.super_IString.str._M_str = pcVar3;
  name_06.super_IString.str._M_len = sVar2;
  addImport(pIVar5,local_68,name_06,local_130,(Type)0x3);
  pcVar3 = DAT_011759c0;
  sVar2 = store_val_f32;
  local_58.id = 2;
  local_50 = 4;
  types_07._M_len = 2;
  types_07._M_array = &local_58;
  wasm::Type::Type(&local_a0,types_07);
  name_07.super_IString.str._M_str = pcVar3;
  name_07.super_IString.str._M_len = sVar2;
  addImport(pIVar5,pMVar4,name_07,local_a0,(Type)0x4);
  pcVar3 = DAT_011759d0;
  sVar2 = store_val_f64;
  local_58.id = 2;
  local_50 = 5;
  types_08._M_len = 2;
  types_08._M_array = &local_58;
  wasm::Type::Type(&local_128,types_08);
  pIVar5 = local_60;
  name_08.super_IString.str._M_str = pcVar3;
  name_08.super_IString.str._M_len = sVar2;
  addImport(local_60,pMVar4,name_08,local_128,(Type)0x5);
  if (((pMVar4->features).features & 0x400) != 0) {
    local_38.id = struct_get_val_i32;
    local_70 = DAT_011759e0;
    local_58.id = 2;
    local_50 = 2;
    types_09._M_len = 2;
    types_09._M_array = &local_58;
    wasm::Type::Type(&local_120,types_09);
    name_09.super_IString.str._M_str = local_70;
    name_09.super_IString.str._M_len = local_38.id;
    addImport(pIVar5,pMVar4,name_09,local_120,(Type)0x2);
    pcVar3 = DAT_011759f0;
    sVar2 = struct_get_val_i64;
    local_58.id = 2;
    local_50 = 3;
    types_10._M_len = 2;
    types_10._M_array = &local_58;
    wasm::Type::Type(&local_118,types_10);
    pIVar5 = local_60;
    name_10.super_IString.str._M_str = pcVar3;
    name_10.super_IString.str._M_len = sVar2;
    addImport(local_60,pMVar4,name_10,local_118,(Type)0x3);
    pcVar3 = DAT_01175a00;
    sVar2 = struct_get_val_f32;
    local_58.id = 2;
    local_50 = 4;
    types_11._M_len = 2;
    types_11._M_array = &local_58;
    wasm::Type::Type(&local_110,types_11);
    pMVar4 = local_68;
    name_11.super_IString.str._M_str = pcVar3;
    name_11.super_IString.str._M_len = sVar2;
    addImport(pIVar5,local_68,name_11,local_110,(Type)0x4);
    pcVar3 = DAT_01175a10;
    sVar2 = struct_get_val_f64;
    local_58.id = 2;
    local_50 = 5;
    types_12._M_len = 2;
    types_12._M_array = &local_58;
    wasm::Type::Type(&local_98,types_12);
    name_12.super_IString.str._M_str = pcVar3;
    name_12.super_IString.str._M_len = sVar2;
    addImport(pIVar5,pMVar4,name_12,local_98,(Type)0x5);
    pcVar3 = DAT_01175a20;
    sVar2 = struct_set_val_i32;
    local_58.id = 2;
    local_50 = 2;
    types_13._M_len = 2;
    types_13._M_array = &local_58;
    wasm::Type::Type(&local_108,types_13);
    pIVar5 = local_60;
    name_13.super_IString.str._M_str = pcVar3;
    name_13.super_IString.str._M_len = sVar2;
    addImport(local_60,pMVar4,name_13,local_108,(Type)0x2);
    pcVar3 = DAT_01175a30;
    local_38.id = struct_set_val_i64;
    local_58.id = 2;
    local_50 = 3;
    types_14._M_len = 2;
    types_14._M_array = &local_58;
    wasm::Type::Type(&local_100,types_14);
    pMVar4 = local_68;
    name_14.super_IString.str._M_str = pcVar3;
    name_14.super_IString.str._M_len = local_38.id;
    addImport(pIVar5,local_68,name_14,local_100,(Type)0x3);
    pcVar3 = DAT_01175a40;
    local_38.id = struct_set_val_f32;
    local_58.id = 2;
    local_50 = 4;
    types_15._M_len = 2;
    types_15._M_array = &local_58;
    wasm::Type::Type(&local_90,types_15);
    name_15.super_IString.str._M_str = pcVar3;
    name_15.super_IString.str._M_len = local_38.id;
    addImport(pIVar5,pMVar4,name_15,local_90,(Type)0x4);
    pcVar3 = DAT_01175a50;
    sVar2 = struct_set_val_f64;
    local_58.id = 2;
    local_50 = 5;
    types_16._M_len = 2;
    types_16._M_array = &local_58;
    wasm::Type::Type(&local_f8,types_16);
    pIVar5 = local_60;
    pMVar4 = local_68;
    name_16.super_IString.str._M_str = pcVar3;
    name_16.super_IString.str._M_len = sVar2;
    addImport(local_60,local_68,name_16,local_f8,(Type)0x5);
    pcVar3 = DAT_01175a60;
    local_38.id = array_get_val_i32;
    local_58.id = 2;
    local_50 = 2;
    types_17._M_len = 2;
    types_17._M_array = &local_58;
    wasm::Type::Type(&local_f0,types_17);
    name_17.super_IString.str._M_str = pcVar3;
    name_17.super_IString.str._M_len = local_38.id;
    addImport(pIVar5,pMVar4,name_17,local_f0,(Type)0x2);
    pcVar3 = DAT_01175a70;
    local_38.id = array_get_val_i64;
    local_58.id = 2;
    local_50 = 3;
    types_18._M_len = 2;
    types_18._M_array = &local_58;
    wasm::Type::Type(&local_88,types_18);
    name_18.super_IString.str._M_str = pcVar3;
    name_18.super_IString.str._M_len = local_38.id;
    addImport(pIVar5,pMVar4,name_18,local_88,(Type)0x3);
    pcVar3 = DAT_01175a80;
    local_38.id = array_get_val_f32;
    local_58.id = 2;
    local_50 = 4;
    types_19._M_len = 2;
    types_19._M_array = &local_58;
    wasm::Type::Type(&local_e8,types_19);
    pIVar5 = local_60;
    name_19.super_IString.str._M_str = pcVar3;
    name_19.super_IString.str._M_len = local_38.id;
    addImport(local_60,pMVar4,name_19,local_e8,(Type)0x4);
    pcVar3 = DAT_01175a90;
    sVar2 = array_get_val_f64;
    local_58.id = 2;
    local_50 = 5;
    types_20._M_len = 2;
    types_20._M_array = &local_58;
    wasm::Type::Type(&local_e0,types_20);
    pMVar4 = local_68;
    name_20.super_IString.str._M_str = pcVar3;
    name_20.super_IString.str._M_len = sVar2;
    addImport(pIVar5,local_68,name_20,local_e0,(Type)0x5);
    pcVar3 = DAT_01175aa0;
    sVar2 = array_set_val_i32;
    local_58.id = 2;
    local_50 = 2;
    types_21._M_len = 2;
    types_21._M_array = &local_58;
    wasm::Type::Type(&local_80,types_21);
    name_21.super_IString.str._M_str = pcVar3;
    name_21.super_IString.str._M_len = sVar2;
    addImport(pIVar5,pMVar4,name_21,local_80,(Type)0x2);
    pcVar3 = DAT_01175ab0;
    sVar2 = array_set_val_i64;
    local_58.id = 2;
    local_50 = 3;
    types_22._M_len = 2;
    types_22._M_array = &local_58;
    wasm::Type::Type(&local_d8,types_22);
    pIVar5 = local_60;
    name_22.super_IString.str._M_str = pcVar3;
    name_22.super_IString.str._M_len = sVar2;
    addImport(local_60,pMVar4,name_22,local_d8,(Type)0x3);
    pcVar3 = DAT_01175ac0;
    sVar2 = array_set_val_f32;
    local_58.id = 2;
    local_50 = 4;
    types_23._M_len = 2;
    types_23._M_array = &local_58;
    wasm::Type::Type(&local_d0,types_23);
    pMVar4 = local_68;
    name_23.super_IString.str._M_str = pcVar3;
    name_23.super_IString.str._M_len = sVar2;
    addImport(pIVar5,local_68,name_23,local_d0,(Type)0x4);
    pcVar3 = DAT_01175ad0;
    sVar2 = array_set_val_f64;
    local_58.id = 2;
    local_50 = 5;
    types_24._M_len = 2;
    types_24._M_array = &local_58;
    wasm::Type::Type(&local_c8,types_24);
    pIVar5 = local_60;
    name_24.super_IString.str._M_str = pcVar3;
    name_24.super_IString.str._M_len = sVar2;
    addImport(local_60,pMVar4,name_24,local_c8,(Type)0x5);
    pcVar3 = DAT_01175ae0;
    sVar2 = array_get_index;
    local_58.id = 2;
    local_50 = 2;
    types_25._M_len = 2;
    types_25._M_array = &local_58;
    wasm::Type::Type(&local_78,types_25);
    name_25.super_IString.str._M_str = pcVar3;
    name_25.super_IString.str._M_len = sVar2;
    addImport(pIVar5,pMVar4,name_25,local_78,(Type)0x2);
    pcVar3 = DAT_01175af0;
    sVar2 = array_set_index;
    local_58.id = 2;
    local_50 = 2;
    types_26._M_len = 2;
    types_26._M_array = &local_58;
    wasm::Type::Type(&local_c0,types_26);
    name_26.super_IString.str._M_str = pcVar3;
    name_26.super_IString.str._M_len = sVar2;
    addImport(local_60,pMVar4,name_26,local_c0,(Type)0x2);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    auto addressType =
      curr->memories.empty() ? Type::i32 : curr->memories[0]->addressType;

    // Load.
    addImport(curr,
              load_ptr,
              {Type::i32, Type::i32, addressType, addressType},
              addressType);
    addImport(curr, load_val_i32, {Type::i32, Type::i32}, Type::i32);
    addImport(curr, load_val_i64, {Type::i32, Type::i64}, Type::i64);
    addImport(curr, load_val_f32, {Type::i32, Type::f32}, Type::f32);
    addImport(curr, load_val_f64, {Type::i32, Type::f64}, Type::f64);

    // Store.
    addImport(curr,
              store_ptr,
              {Type::i32, Type::i32, addressType, addressType},
              addressType);
    addImport(curr, store_val_i32, {Type::i32, Type::i32}, Type::i32);
    addImport(curr, store_val_i64, {Type::i32, Type::i64}, Type::i64);
    addImport(curr, store_val_f32, {Type::i32, Type::f32}, Type::f32);
    addImport(curr, store_val_f64, {Type::i32, Type::f64}, Type::f64);

    if (curr->features.hasGC()) {
      // Struct get/set.
      addImport(curr, struct_get_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, struct_get_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, struct_get_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, struct_get_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, struct_set_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, struct_set_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, struct_set_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, struct_set_val_f64, {Type::i32, Type::f64}, Type::f64);

      // Array get/set.
      addImport(curr, array_get_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_get_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, array_get_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, array_get_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, array_set_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_set_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, array_set_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, array_set_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, array_get_index, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_set_index, {Type::i32, Type::i32}, Type::i32);
    }
  }